

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_setRange_success_indexInBoundsRangeBeyondSize_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char c;
  code *local_38;
  code *pcStack_30;
  code *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  
  local_38 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_30 = private_ACUtilsTest_ADynArray_free;
  local_20 = (char *)0x3;
  local_28 = private_ACUtilsTest_ADynArray_growStrategy;
  local_18 = (char *)0x8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  local_10 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  local_10[0] = '0';
  local_10[1] = '1';
  local_10[2] = '2';
  c = '5';
  bVar1 = private_ACUtils_ADynArray_setRange(&local_38,2,2,&c,1);
  if (bVar1 == true) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x6e4);
    if (local_20 == (char *)0x4) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x6e5);
      if (local_18 == (char *)0x8) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x6e6);
        if (local_10 == (char *)0x0) {
          pcVar3 = (char *)0x0;
          pcVar7 = (char *)0x0;
          expr = "Assertion \'_ck_x != NULL\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %#x";
          pcVar5 = "(void*) array.buffer != NULL";
          pcVar6 = "(void*) array.buffer";
          iVar2 = 0x6e7;
        }
        else {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x6e7);
          if (local_28 == (code *)0x0) {
            pcVar3 = (char *)0x0;
            pcVar7 = (char *)0x0;
            expr = "Assertion \'_ck_x != NULL\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %#x";
            pcVar5 = "(void*) array.growStrategy != NULL";
            pcVar6 = "(void*) array.growStrategy";
            iVar2 = 0x6e8;
          }
          else {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x6e8);
            pcVar7 = local_10;
            local_10[(long)local_20] = '\0';
            if (local_10 == (char *)0x0) {
              pcVar3 = "";
              pcVar7 = "(null)";
            }
            else {
              iVar2 = strcmp("0155",local_10);
              if (iVar2 == 0) {
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x6ea);
                if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                              ,0x6eb);
                  c = '1';
                  bVar1 = private_ACUtils_ADynArray_setRange(&local_38,2,4,&c,1);
                  if (bVar1 == true) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                ,0x6ed);
                    if (local_20 == (char *)0x6) {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                  ,0x6ee);
                      if (local_18 == (char *)0x8) {
                        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                    ,0x6ef);
                        if (local_10 == (char *)0x0) {
                          pcVar7 = (char *)0x0;
                          expr = "Assertion \'_ck_x != NULL\' failed";
                          pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                          pcVar5 = "(void*) array.buffer != NULL";
                          pcVar6 = "(void*) array.buffer";
                          iVar2 = 0x6f0;
                          pcVar3 = (char *)0x0;
                        }
                        else {
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                      ,0x6f0);
                          if (local_28 == (code *)0x0) {
                            pcVar7 = (char *)0x0;
                            expr = "Assertion \'_ck_x != NULL\' failed";
                            pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                            pcVar5 = "(void*) array.growStrategy != NULL";
                            pcVar6 = "(void*) array.growStrategy";
                            iVar2 = 0x6f1;
                            pcVar3 = (char *)0x0;
                          }
                          else {
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                        ,0x6f1);
                            pcVar7 = local_10;
                            local_10[(long)local_20] = '\0';
                            if (local_10 == (char *)0x0) {
                              pcVar7 = "(null)";
                              pcVar3 = "";
                            }
                            else {
                              iVar2 = strcmp("011111",local_10);
                              if (iVar2 == 0) {
                                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                            ,0x6f3);
                                if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                              ,0x6f4);
                                  (*pcStack_30)(local_10);
                                  return;
                                }
                                pcVar7 = "0";
                                expr = "Assertion \'_ck_x == _ck_y\' failed";
                                pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
                                pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount";
                                iVar2 = 0x6f4;
                                pcVar3 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
                                goto LAB_00119ad3;
                              }
                              pcVar3 = "\"";
                            }
                            expr = 
                            "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                            ;
                            pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                            pcVar5 = "array.buffer == \"011111\"";
                            pcVar6 = "array.buffer";
                            iVar2 = 0x6f3;
                          }
                        }
                      }
                      else {
                        pcVar7 = "8";
                        expr = "Assertion \'_ck_x == _ck_y\' failed";
                        pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                        pcVar5 = "array.capacity == 8";
                        pcVar6 = "array.capacity";
                        iVar2 = 0x6ef;
                        pcVar3 = local_18;
                      }
                    }
                    else {
                      pcVar7 = "6";
                      expr = "Assertion \'_ck_x == _ck_y\' failed";
                      pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                      pcVar5 = "array.size == 6";
                      pcVar6 = "array.size";
                      iVar2 = 0x6ee;
                      pcVar3 = local_20;
                    }
                  }
                  else {
                    pcVar7 = "true";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar5 = 
                    "private_ACUtils_ADynArray_setRange(&array, 2, 4, &(c), sizeof(*(&array)->buffer)) == true"
                    ;
                    pcVar6 = 
                    "private_ACUtils_ADynArray_setRange(&array, 2, 4, &(c), sizeof(*(&array)->buffer))"
                    ;
                    iVar2 = 0x6ed;
                    pcVar3 = (char *)(ulong)bVar1;
                  }
                }
                else {
                  pcVar7 = "0";
                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                  pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                  pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
                  pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount";
                  iVar2 = 0x6eb;
                  pcVar3 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
                }
                goto LAB_00119ad3;
              }
              pcVar3 = "\"";
            }
            expr = 
            "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
            ;
            pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
            pcVar5 = "array.buffer == \"0155\"";
            pcVar6 = "array.buffer";
            iVar2 = 0x6ea;
          }
        }
      }
      else {
        pcVar7 = "8";
        expr = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar5 = "array.capacity == 8";
        pcVar6 = "array.capacity";
        iVar2 = 0x6e6;
        pcVar3 = local_18;
      }
    }
    else {
      pcVar7 = "4";
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar5 = "array.size == 4";
      pcVar6 = "array.size";
      iVar2 = 0x6e5;
      pcVar3 = local_20;
    }
  }
  else {
    pcVar3 = (char *)(ulong)bVar1;
    pcVar7 = "true";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar5 = 
    "private_ACUtils_ADynArray_setRange(&array, 2, 2, &(c), sizeof(*(&array)->buffer)) == true";
    pcVar6 = "private_ACUtils_ADynArray_setRange(&array, 2, 2, &(c), sizeof(*(&array)->buffer))";
    iVar2 = 0x6e4;
  }
LAB_00119ad3:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar4,pcVar5,pcVar6,pcVar3,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_setRange_success_indexInBoundsRangeBeyondSize)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 3;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "012", 3);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    char c = '5';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_setRange(&array, 2, 2, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 4);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.buffer[array.size] = '\0';
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "0155");
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    c = '1';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_setRange(&array, 2, 4, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 6);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.buffer[array.size] = '\0';
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "011111");
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}